

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

NumberStringBuilder * __thiscall
icu_63::number::impl::NumberStringBuilder::operator=
          (NumberStringBuilder *this,NumberStringBuilder *other)

{
  char16_t *dest;
  char16_t *src;
  Field *dest_00;
  Field *src_00;
  NumberStringBuilder local_138;
  UNumberFormatFields *local_38;
  Field *newFields;
  char16_t *newChars;
  NumberStringBuilder *pNStack_20;
  int32_t capacity;
  NumberStringBuilder *other_local;
  NumberStringBuilder *this_local;
  
  if (this != other) {
    pNStack_20 = other;
    other_local = this;
    if ((this->fUsingHeap & 1U) != 0) {
      uprv_free_63((this->fChars).heap.ptr);
      uprv_free_63((this->fFields).heap.ptr);
      this->fUsingHeap = false;
    }
    newChars._4_4_ = getCapacity(pNStack_20);
    if (0x28 < newChars._4_4_) {
      newFields = (Field *)uprv_malloc_63((long)newChars._4_4_ << 1);
      local_38 = (UNumberFormatFields *)uprv_malloc_63((long)newChars._4_4_ << 2);
      if ((newFields == (Field *)0x0) || (local_38 == (UNumberFormatFields *)0x0)) {
        uprv_free_63(newFields);
        uprv_free_63(local_38);
        NumberStringBuilder(&local_138);
        operator=(this,&local_138);
        ~NumberStringBuilder(&local_138);
        return this;
      }
      this->fUsingHeap = true;
      (this->fChars).heap.capacity = newChars._4_4_;
      (this->fChars).heap.ptr = (char16_t *)newFields;
      (this->fFields).heap.capacity = newChars._4_4_;
      (this->fFields).heap.ptr = local_38;
    }
    dest = getCharPtr(this);
    src = getCharPtr(pNStack_20);
    anon_unknown.dwarf_156f03::uprv_memcpy2(dest,src,(long)newChars._4_4_ << 1);
    dest_00 = getFieldPtr(this);
    src_00 = getFieldPtr(pNStack_20);
    anon_unknown.dwarf_156f03::uprv_memcpy2(dest_00,src_00,(long)newChars._4_4_ << 2);
    this->fZero = pNStack_20->fZero;
    this->fLength = pNStack_20->fLength;
  }
  return this;
}

Assistant:

NumberStringBuilder &NumberStringBuilder::operator=(const NumberStringBuilder &other) {
    // Check for self-assignment
    if (this == &other) {
        return *this;
    }

    // Continue with deallocation and copying
    if (fUsingHeap) {
        uprv_free(fChars.heap.ptr);
        uprv_free(fFields.heap.ptr);
        fUsingHeap = false;
    }

    int32_t capacity = other.getCapacity();
    if (capacity > DEFAULT_CAPACITY) {
        // FIXME: uprv_malloc
        // C++ note: malloc appears in two places: here and in prepareForInsertHelper.
        auto newChars = static_cast<char16_t *> (uprv_malloc(sizeof(char16_t) * capacity));
        auto newFields = static_cast<Field *>(uprv_malloc(sizeof(Field) * capacity));
        if (newChars == nullptr || newFields == nullptr) {
            // UErrorCode is not available; fail silently.
            uprv_free(newChars);
            uprv_free(newFields);
            *this = NumberStringBuilder();  // can't fail
            return *this;
        }

        fUsingHeap = true;
        fChars.heap.capacity = capacity;
        fChars.heap.ptr = newChars;
        fFields.heap.capacity = capacity;
        fFields.heap.ptr = newFields;
    }

    uprv_memcpy2(getCharPtr(), other.getCharPtr(), sizeof(char16_t) * capacity);
    uprv_memcpy2(getFieldPtr(), other.getFieldPtr(), sizeof(Field) * capacity);

    fZero = other.fZero;
    fLength = other.fLength;
    return *this;
}